

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_keys_values.cpp
# Opt level: O0

void duckdb::MapKeyValueFunction
               (DataChunk *args,ExpressionState *state,Vector *result,
               _func_Vector_ptr_Vector_ptr *get_child_vector)

{
  LogicalTypeId LVar1;
  VectorType VVar2;
  bool bVar3;
  reference this;
  LogicalType *this_00;
  Vector *count_00;
  Vector *vec;
  code *in_RCX;
  Vector *in_RDX;
  DataChunk *in_RDI;
  idx_t list_size;
  UnifiedVectorFormat map_data;
  Vector *entries;
  Vector child;
  idx_t count;
  value_type *map;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  Vector *in_stack_fffffffffffffef0;
  UnifiedVectorFormat *in_stack_ffffffffffffff00;
  Vector *this_01;
  DataChunk *in_stack_ffffffffffffff08;
  undefined8 local_f0;
  undefined7 in_stack_ffffffffffffff18;
  VectorType in_stack_ffffffffffffff1f;
  Vector *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  Vector *in_stack_ffffffffffffff40;
  UnifiedVectorFormat *in_stack_ffffffffffffffb0;
  idx_t in_stack_ffffffffffffffb8;
  Vector *in_stack_ffffffffffffffc0;
  
  this = vector<duckdb::Vector,_true>::operator[]
                   ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffef0,
                    CONCAT17(in_stack_fffffffffffffeef,
                             CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
  this_00 = Vector::GetType(this);
  LVar1 = LogicalType::id(this_00);
  if (LVar1 == SQLNULL) {
    Vector::SetVectorType(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
    ConstantVector::SetNull(in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
  }
  else {
    DataChunk::size(in_RDI);
    (*in_RCX)(this);
    Vector::Vector(in_stack_ffffffffffffff20,
                   (Vector *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    count_00 = ListVector::GetEntry((Vector *)0x206b566);
    Vector::Reference(in_stack_ffffffffffffff40,
                      (Vector *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff00);
    Vector::ToUnifiedFormat
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    FlatVector::SetData(in_RDX,local_f0);
    FlatVector::SetValidity
              (in_stack_fffffffffffffef0,
               (ValidityMask *)
               CONCAT17(in_stack_fffffffffffffeef,
                        CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
    vec = (Vector *)
          ListVector::GetListSize
                    ((Vector *)
                     CONCAT17(in_stack_fffffffffffffeef,
                              CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
    this_01 = vec;
    ListVector::SetListSize
              (vec,CONCAT17(in_stack_fffffffffffffeef,
                            CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
    VVar2 = Vector::GetVectorType(this);
    if (VVar2 == DICTIONARY_VECTOR) {
      Vector::Slice((Vector *)args,(SelectionVector *)state,(idx_t)result);
    }
    bVar3 = DataChunk::AllConstant(in_stack_ffffffffffffff08);
    if (bVar3) {
      Vector::SetVectorType(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
    }
    Vector::Verify(this_01,(idx_t)count_00);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)vec);
    Vector::~Vector(vec);
  }
  return;
}

Assistant:

static void MapKeyValueFunction(DataChunk &args, ExpressionState &state, Vector &result,
                                Vector &(*get_child_vector)(Vector &)) {
	auto &map = args.data[0];

	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	if (map.GetType().id() == LogicalTypeId::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	auto count = args.size();
	D_ASSERT(map.GetType().id() == LogicalTypeId::MAP);
	auto child = get_child_vector(map);

	auto &entries = ListVector::GetEntry(result);
	entries.Reference(child);

	UnifiedVectorFormat map_data;
	map.ToUnifiedFormat(count, map_data);

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	FlatVector::SetData(result, map_data.data);
	FlatVector::SetValidity(result, map_data.validity);
	auto list_size = ListVector::GetListSize(map);
	ListVector::SetListSize(result, list_size);
	if (map.GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		result.Slice(*map_data.sel, count);
	}
	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(count);
}